

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EbmlMaster.cpp
# Opt level: O3

EbmlElement * __thiscall libebml::EbmlMaster::FindNextElt(EbmlMaster *this,EbmlElement *PastElt)

{
  long lVar1;
  int iVar2;
  pointer ppEVar3;
  pointer ppEVar4;
  int iVar5;
  ulong uVar6;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ulong uVar7;
  
  ppEVar3 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_start;
  ppEVar4 = (this->ElementList).
            super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
            _M_impl.super__Vector_impl_data._M_finish;
  uVar6 = (long)ppEVar4 - (long)ppEVar3 >> 3;
  if (ppEVar4 == ppEVar3) {
    uVar7 = 0;
LAB_00185264:
    for (; uVar7 < uVar6; uVar7 = uVar7 + 1) {
      iVar5 = (*PastElt->_vptr_EbmlElement[3])(PastElt);
      iVar2 = *(int *)CONCAT44(extraout_var,iVar5);
      lVar1 = *(long *)((int *)CONCAT44(extraout_var,iVar5) + 2);
      iVar5 = (*(this->ElementList).
                super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
                _M_impl.super__Vector_impl_data._M_start[uVar7]->_vptr_EbmlElement[3])();
      if ((*(long *)((int *)CONCAT44(extraout_var_00,iVar5) + 2) == lVar1) &&
         (*(int *)CONCAT44(extraout_var_00,iVar5) == iVar2)) {
        return (this->ElementList).
               super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar7];
      }
      uVar6 = (long)(this->ElementList).
                    super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)(this->ElementList).
                    super__Vector_base<libebml::EbmlElement_*,_std::allocator<libebml::EbmlElement_*>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 3;
    }
  }
  else {
    uVar7 = 1;
    do {
      if (ppEVar3[uVar7 - 1] == PastElt) goto LAB_00185264;
      lVar1 = (-(ulong)(uVar6 == 0) - uVar6) + uVar7;
      uVar7 = uVar7 + 1;
    } while (lVar1 != 0);
  }
  return (EbmlElement *)0x0;
}

Assistant:

EbmlElement *EbmlMaster::FindNextElt(const EbmlElement & PastElt) const
{
  size_t Index;

  for (Index = 0; Index < ElementList.size(); Index++) {
    if ((ElementList[Index]) == &PastElt) {
      // found past element, new one is :
      Index++;
      break;
    }
  }

  while (Index < ElementList.size()) {
    if ((EbmlId)PastElt == (EbmlId)(*ElementList[Index]))
      return ElementList[Index];
    Index++;
  }

  return NULL;
}